

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void LOADCallDllMain(DWORD dwReason,LPVOID lpReserved)

{
  bool bVar1;
  PalThreadType PVar2;
  CPalThread *this;
  CPalThread *pThread;
  MODSTRUCT *pMStack_20;
  BOOL InLoadOrder;
  MODSTRUCT *module;
  LPVOID lpReserved_local;
  DWORD dwReason_local;
  
  bVar1 = true;
  this = CorUnix::InternalGetCurrentThread();
  PVar2 = CorUnix::CPalThread::GetThreadType(this);
  if (PVar2 == UserCreatedThread) {
    switch(dwReason) {
    case 0:
      fprintf(_stderr,"] %s %s:%d","LOADCallDllMain",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
              ,0x3cc);
      fprintf(_stderr,"got called with DLL_PROCESS_DETACH parameter! Why?\n");
      bVar1 = false;
      break;
    case 1:
      fprintf(_stderr,"] %s %s:%d","LOADCallDllMain",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
              ,0x3c9);
      fprintf(_stderr,"got called with DLL_PROCESS_ATTACH parameter! Why?\n");
      break;
    case 2:
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      break;
    case 3:
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      bVar1 = false;
      break;
    default:
      fprintf(_stderr,"] %s %s:%d","LOADCallDllMain",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
              ,0x3d7);
      fprintf(_stderr,"LOADCallDllMain called with unknown parameter %d!\n",(ulong)dwReason);
      return;
    }
    LockModuleList();
    pMStack_20 = &exe_module;
    do {
      if (!bVar1) {
        pMStack_20 = pMStack_20->prev;
      }
      if ((pMStack_20->threadLibCalls != 0) && (pMStack_20->pDllMain != (PDLLMAIN)0x0)) {
        LOADCallDllMainSafe(pMStack_20,dwReason,lpReserved);
      }
      if (bVar1) {
        pMStack_20 = pMStack_20->next;
      }
    } while (pMStack_20 != &exe_module);
    UnlockModuleList();
  }
  return;
}

Assistant:

void LOADCallDllMain(DWORD dwReason, LPVOID lpReserved)
{
    MODSTRUCT *module = nullptr;
    BOOL InLoadOrder = TRUE; /* true if in load order, false for reverse */
    CPalThread *pThread;

    pThread = InternalGetCurrentThread();
    if (UserCreatedThread != pThread->GetThreadType())
    {
        return;
    }

    /* Validate dwReason */
    switch(dwReason)
    {
    case DLL_PROCESS_ATTACH:
        ASSERT("got called with DLL_PROCESS_ATTACH parameter! Why?\n");
        break;
    case DLL_PROCESS_DETACH:
        ASSERT("got called with DLL_PROCESS_DETACH parameter! Why?\n");
        InLoadOrder = FALSE;
        break;
    case DLL_THREAD_ATTACH:
        TRACE("Calling DllMain(DLL_THREAD_ATTACH) on all known modules.\n");
        break;
    case DLL_THREAD_DETACH:
        TRACE("Calling DllMain(DLL_THREAD_DETACH) on all known modules.\n");
        InLoadOrder = FALSE;
        break;
    default:
        ASSERT("LOADCallDllMain called with unknown parameter %d!\n", dwReason);
        return;
    }

    LockModuleList();

    module = &exe_module;

    do
    {
        if (!InLoadOrder)
            module = module->prev;

        if (module->threadLibCalls)
        {
            if (module->pDllMain)
            {
                LOADCallDllMainSafe(module, dwReason, lpReserved);
            }
        }

        if (InLoadOrder)
            module = module->next;

    } while (module != &exe_module);

    UnlockModuleList();
}